

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

expression_ptr __thiscall mjs::parser::parse_expression(parser *this)

{
  pointer *__ptr;
  expression_ptr *in_RSI;
  undefined1 local_38 [8];
  position_stack_node _expression_position__LINE__;
  
  _expression_position__LINE__.stack_ = (position_stack_node **)(in_RSI + 0xd);
  _expression_position__LINE__.prev_ =
       (position_stack_node *)
       in_RSI[0xd]._M_t.
       super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
       super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  in_RSI[0xd]._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (expression *)&_expression_position__LINE__;
  _expression_position__LINE__.pos_ =
       *(uint32_t *)
        ((long)&in_RSI[0xc]._M_t.
                super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
                super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl + 4);
  parse_assignment_expression((parser *)local_38);
  parse_expression1(this,in_RSI,(int)local_38);
  if (local_38 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  position_stack_node::~position_stack_node(&_expression_position__LINE__);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_expression() {
        RECORD_EXPRESSION_START;
        return parse_expression1(parse_assignment_expression(), comma_precedence);
    }